

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall
MakefileGenerator::fileFixify(MakefileGenerator *this,QString *file,FileFixifyTypes fix,bool canon)

{
  QChar c;
  bool bVar1;
  byte bVar2;
  Int IVar3;
  ulong uVar4;
  qsizetype qVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long in_RSI;
  QString *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  int o;
  int remlen;
  int sl;
  int i;
  int depth;
  QString *ret;
  QString dot_prefix;
  QString match_dir;
  QFileInfo qfileinfo;
  QString qfile;
  QFileInfo out_fi;
  QFileInfo in_fi_1;
  QString in_dir;
  QString out_dir;
  QFileInfo in_fi;
  QString pwd;
  QString orig_file;
  QMakeProject *in_stack_fffffffffffffa88;
  FileFixifyType other;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined2 in_stack_fffffffffffffa9c;
  ushort uVar10;
  undefined1 in_stack_fffffffffffffa9e;
  undefined1 uVar11;
  QLatin1Char in_stack_fffffffffffffa9f;
  undefined1 uVar12;
  ProString *in_stack_fffffffffffffaa0;
  undefined2 uVar13;
  QMakeProject *in_stack_fffffffffffffaa8;
  QStringBuilder<const_char_(&)[3],_QString_&> *in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  char *in_stack_fffffffffffffac8;
  byte local_519;
  byte local_50a;
  bool local_4fa;
  bool local_4f9;
  int local_4dc;
  int iVar14;
  uint uVar15;
  int local_4c8;
  byte bVar17;
  uint uVar16;
  undefined1 local_3e0 [48];
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined1 local_308 [24];
  QStringBuilder<QString_&,_QString_&> local_2f0;
  undefined1 local_2e0 [24];
  QString local_2c8 [2];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_298;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_1f0 [7];
  undefined8 local_1b8;
  QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4> local_1ac;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4> local_18c;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  QLatin1Char local_157 [4];
  QLatin1Char local_153;
  ushort local_152;
  undefined8 local_120;
  QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4> local_114;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4> local_f4;
  QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4> local_d8;
  QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4> local_d4;
  undefined1 local_b8 [120];
  CaseSensitivity local_40;
  QLatin1Char local_2b;
  ushort local_2a;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QFlags local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar17 = in_R8B & 1;
  bVar1 = QString::isEmpty((QString *)0x1760c7);
  if (bVar1) {
    QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    goto LAB_001771a2;
  }
  uVar10 = (ushort)(((uint)bVar17 << 0x18) >> 0x10);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
  QLatin1Char::QLatin1Char(&local_2b,'~');
  QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa9f);
  uVar4 = QString::startsWith((QChar)(char16_t)in_RDI,(uint)local_2a);
  if ((uVar4 & 1) != 0) {
    QLatin1String::QLatin1String
              ((QLatin1String *)in_stack_fffffffffffffaa0,
               (char *)CONCAT17(in_stack_fffffffffffffa9f.ch,
                                CONCAT16(in_stack_fffffffffffffa9e,
                                         CONCAT24(in_stack_fffffffffffffa9c,
                                                  in_stack_fffffffffffffa98))));
    uVar4 = QString::startsWith((QLatin1String *)in_RDI,local_40);
    if ((uVar4 & 1) == 0) {
      QString::toLatin1((QString *)in_stack_fffffffffffffa88);
      pcVar6 = QByteArray::constData((QByteArray *)0x1762bc);
      warn_msg(WarnLogic,"Unable to expand ~ in %s",pcVar6);
      QByteArray::~QByteArray((QByteArray *)0x1762df);
    }
    else {
      QDir::homePath();
      QString::mid((longlong)local_b8,(longlong)in_RDI);
      ::operator+((QString *)
                  CONCAT17(in_stack_fffffffffffffa9f.ch,
                           CONCAT16(in_stack_fffffffffffffa9e,
                                    CONCAT24(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))),
                  &in_stack_fffffffffffffa90->a);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffffa88);
      QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      QString::~QString((QString *)0x176271);
      QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffffa90);
      QString::~QString((QString *)0x17628b);
      QString::~QString((QString *)0x176298);
    }
  }
  local_d4.super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
       (QFlagsStorage<MakefileGenerator::FileFixifyType>)
       QFlags<MakefileGenerator::FileFixifyType>::operator&
                 ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffa90,
                  (FileFixifyType)((ulong)in_stack_fffffffffffffa88 >> 0x20));
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d4);
  uVar16 = (uint)uVar10 << 0x10;
  local_4f9 = true;
  if (IVar3 == 0) {
    local_d8.super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
         (QFlagsStorage<MakefileGenerator::FileFixifyType>)
         QFlags<MakefileGenerator::FileFixifyType>::operator&
                   ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffa90,
                    (FileFixifyType)((ulong)in_stack_fffffffffffffa88 >> 0x20));
    bVar1 = QFlags<MakefileGenerator::FileFixifyType>::operator!
                      ((QFlags<MakefileGenerator::FileFixifyType> *)&local_d8);
    local_4fa = false;
    if (bVar1) {
      QString::QString((QString *)
                       CONCAT17(in_stack_fffffffffffffa9f.ch,
                                CONCAT16(in_stack_fffffffffffffa9e,
                                         CONCAT24(in_stack_fffffffffffffa9c,
                                                  in_stack_fffffffffffffa98))),
                       in_stack_fffffffffffffac8);
      uVar16 = CONCAT22((short)(uVar16 >> 0x10),0x100);
      local_4fa = QMakeProject::isActiveConfig
                            ((QMakeProject *)
                             CONCAT17(in_stack_fffffffffffffa9f.ch,
                                      CONCAT16(in_stack_fffffffffffffa9e,
                                               CONCAT24(in_stack_fffffffffffffa9c,
                                                        in_stack_fffffffffffffa98))),
                             &in_stack_fffffffffffffa90->a,
                             SUB81((ulong)in_stack_fffffffffffffa88 >> 0x38,0));
    }
    local_4f9 = local_4fa;
  }
  if ((uVar16 & 0x100) != 0) {
    QString::~QString((QString *)0x1763c6);
  }
  bVar17 = (byte)(uVar16 >> 0x18);
  other = (FileFixifyType)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  if (local_4f9 == false) {
    local_188 = 0xaaaaaaaaaaaaaaaa;
    local_180 = 0xaaaaaaaaaaaaaaaa;
    local_178 = 0xaaaaaaaaaaaaaaaa;
    local_18c.super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
         (QFlagsStorage<MakefileGenerator::FileFixifyType>)
         QFlags<MakefileGenerator::FileFixifyType>::operator&
                   ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffa90,other);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18c);
    if (IVar3 == 0) {
      QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    }
    else {
      QMakeProject::projectDir(in_stack_fffffffffffffa88);
    }
    local_1a8 = 0xaaaaaaaaaaaaaaaa;
    local_1a0 = 0xaaaaaaaaaaaaaaaa;
    local_198 = 0xaaaaaaaaaaaaaaaa;
    local_1ac.super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
         (QFlagsStorage<MakefileGenerator::FileFixifyType>)
         QFlags<MakefileGenerator::FileFixifyType>::operator&
                   ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffa90,
                    (FileFixifyType)((ulong)in_stack_fffffffffffffa88 >> 0x20));
    bVar1 = QFlags<MakefileGenerator::FileFixifyType>::operator!
                      ((QFlags<MakefileGenerator::FileFixifyType> *)&local_1ac);
    if (bVar1) {
      QMakeProject::projectDir(in_stack_fffffffffffffa88);
    }
    else {
      QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    }
    local_1b8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    fileInfo((MakefileGenerator *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
             (QString *)in_stack_fffffffffffffab8);
    QString::~QString((QString *)0x1767a4);
    uVar4 = QFileInfo::exists();
    if ((uVar4 & 1) != 0) {
      QFileInfo::canonicalFilePath();
      QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      QString::~QString((QString *)0x1767ee);
    }
    local_1f0[0] = 0xaaaaaaaaaaaaaaaa;
    QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    fileInfo((MakefileGenerator *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
             (QString *)in_stack_fffffffffffffab8);
    QString::~QString((QString *)0x17683c);
    uVar4 = QFileInfo::exists();
    if ((uVar4 & 1) != 0) {
      QFileInfo::canonicalFilePath();
      QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      QString::~QString((QString *)0x176886);
    }
    QFileInfo::~QFileInfo((QFileInfo *)local_1f0);
    QFileInfo::~QFileInfo((QFileInfo *)&local_1b8);
    local_238 = 0xaaaaaaaaaaaaaaaa;
    local_230 = 0xaaaaaaaaaaaaaaaa;
    local_228 = 0xaaaaaaaaaaaaaaaa;
    Option::normalizePath
              ((QString *)in_stack_fffffffffffffaa8,
               SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x30,0));
    local_240 = 0xaaaaaaaaaaaaaaaa;
    QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    fileInfo((MakefileGenerator *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
             (QString *)in_stack_fffffffffffffab8);
    QString::~QString((QString *)0x176937);
    bVar1 = ::operator!=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    if (bVar1) {
LAB_00176965:
      uVar4 = QFileInfo::isRelative();
      if ((uVar4 & 1) != 0) {
        local_298 = ::operator+(&in_stack_fffffffffffffa90->a,
                                (char (*) [2])in_stack_fffffffffffffa88);
        ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_fffffffffffffa90,
                    (QString *)in_stack_fffffffffffffa88);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                   in_stack_fffffffffffffa88);
        QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
        QString::~QString((QString *)0x1769f3);
        QFileInfo::setFile((QString *)&local_240);
      }
      Option::fixPathToTargetOS
                ((QString *)in_stack_fffffffffffffaa8,
                 SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x30,0));
      QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      QString::~QString((QString *)0x176a4d);
      local_2c8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_2c8[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_2c8[0].d.size = -0x5555555555555556;
      Option::fixPathToTargetOS
                ((QString *)in_stack_fffffffffffffaa8,
                 SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x30,0));
      bVar1 = ::operator==(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      bVar17 = (byte)(uVar16 >> 0x18);
      if (bVar1) {
        QString::operator=((QString *)
                           CONCAT17(in_stack_fffffffffffffa9f.ch,
                                    CONCAT16(in_stack_fffffffffffffa9e,
                                             CONCAT24(in_stack_fffffffffffffa9c,
                                                      in_stack_fffffffffffffa98))),
                           (char *)in_stack_fffffffffffffab8);
      }
      else {
        local_2f0 = ::operator+(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffffa88);
        bVar2 = QString::startsWith((QString *)in_RDI,(CaseSensitivity)local_2e0);
        QString::~QString((QString *)0x176b35);
        bVar17 = (byte)(uVar16 >> 0x18);
        if ((bVar2 & 1) == 0) {
          local_4c8 = 4;
          if ((Option::qmake_mode == QMAKE_GENERATE_MAKEFILE) ||
             (Option::qmake_mode == QMAKE_GENERATE_PRL)) {
            uVar15 = 0;
            local_519 = 0;
            if (*(long *)(in_RSI + 0xd8) != 0) {
              ProKey::ProKey((ProKey *)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
              uVar15 = 0x1000000;
              bVar1 = QMakeProject::isEmpty
                                (in_stack_fffffffffffffaa8,(ProKey *)in_stack_fffffffffffffaa0);
              local_519 = bVar1 ^ 0xff;
            }
            if ((uVar15 & 0x1000000) != 0) {
              ProKey::~ProKey((ProKey *)0x176c5b);
            }
            if ((local_519 & 1) == 0) {
              if (Option::mkfile::cachefile_depth != -1) {
                local_4c8 = Option::mkfile::cachefile_depth;
              }
            }
            else {
              ProKey::ProKey((ProKey *)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
              QMakeEvaluator::first
                        (&in_stack_fffffffffffffaa8->super_QMakeEvaluator,
                         (ProKey *)in_stack_fffffffffffffaa0);
              local_4c8 = ProString::toInt(in_stack_fffffffffffffaa0,
                                           (bool *)CONCAT17(in_stack_fffffffffffffa9f.ch,
                                                            CONCAT16(in_stack_fffffffffffffa9e,
                                                                     CONCAT24(
                                                  in_stack_fffffffffffffa9c,
                                                  in_stack_fffffffffffffa98))),
                                           (int)((ulong)in_stack_fffffffffffffa90 >> 0x20));
              ProString::~ProString((ProString *)0x176cd1);
              ProKey::~ProKey((ProKey *)0x176cde);
            }
          }
          local_3b0 = 0xaaaaaaaaaaaaaaaa;
          local_3a8 = 0xaaaaaaaaaaaaaaaa;
          local_3a0 = 0xaaaaaaaaaaaaaaaa;
          QString::QString((QString *)0x176d3a);
          iVar14 = 1;
LAB_00176d45:
          bVar17 = (byte)(uVar16 >> 0x18);
          if (iVar14 <= local_4c8) {
            qVar5 = QString::lastIndexOf
                              (&in_stack_fffffffffffffaa0->m_string,
                               (QString *)
                               CONCAT17(in_stack_fffffffffffffa9f.ch,
                                        CONCAT16(in_stack_fffffffffffffa9e,
                                                 CONCAT24(in_stack_fffffffffffffa9c,
                                                          in_stack_fffffffffffffa98))),
                               (CaseSensitivity)((ulong)in_stack_fffffffffffffa90 >> 0x20));
            bVar17 = (byte)(uVar16 >> 0x18);
            if ((int)qVar5 != -1) {
              QString::left((QString *)in_stack_fffffffffffffaa8,
                            (qsizetype)in_stack_fffffffffffffaa0);
              QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88)
              ;
              QString::~QString((QString *)0x176dc7);
              bVar1 = QString::isEmpty((QString *)0x176dd4);
              bVar17 = (byte)(uVar16 >> 0x18);
              if (!bVar1) {
                ::operator+(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffffa88);
                bVar2 = QString::startsWith((QString *)in_RDI,(CaseSensitivity)local_3e0);
                QString::~QString((QString *)0x176e43);
                if ((bVar2 & 1) == 0) goto LAB_00176f43;
                in_stack_fffffffffffffab8 =
                     (QStringBuilder<const_char_(&)[3],_QString_&> *)QString::size(in_RDI);
                QString::size(local_2c8);
                QString::right((QString *)in_stack_fffffffffffffaa8,
                               (qsizetype)in_stack_fffffffffffffaa0);
                QString::operator=(&in_stack_fffffffffffffa90->a,
                                   (QString *)in_stack_fffffffffffffa88);
                QString::~QString((QString *)0x176ed9);
                for (local_4dc = 0; bVar17 = (byte)(uVar16 >> 0x18), local_4dc < iVar14;
                    local_4dc = local_4dc + 1) {
                  ::operator+((char (*) [3])in_stack_fffffffffffffa90,
                              (QString *)in_stack_fffffffffffffa88);
                  ::operator+=((QString *)CONCAT17(bVar2,in_stack_fffffffffffffac0),
                               in_stack_fffffffffffffab8);
                }
              }
            }
          }
          QString::prepend(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
          QString::~QString((QString *)0x176f7b);
          goto LAB_00176f7d;
        }
        QString::size(local_2c8);
        QString::size(&Option::dir_sep);
        QString::mid((longlong)local_308,(longlong)in_RDI);
        QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
        QString::~QString((QString *)0x176ba3);
      }
LAB_00176f7d:
      QString::~QString((QString *)0x176f8a);
    }
    else {
      uVar4 = QFileInfo::isRelative();
      bVar17 = (byte)(uVar16 >> 0x18);
      if ((uVar4 & 1) == 0) goto LAB_00176965;
      Option::fixPathToTargetOS
                ((QString *)in_stack_fffffffffffffaa8,
                 SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x30,0));
      QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      QString::~QString((QString *)0x176fd1);
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_240);
    QString::~QString((QString *)0x176feb);
    QString::~QString((QString *)0x176ff8);
    QString::~QString((QString *)0x177005);
  }
  else {
    local_f4.super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
         (QFlagsStorage<MakefileGenerator::FileFixifyType>)
         QFlags<MakefileGenerator::FileFixifyType>::operator&
                   ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffa90,other);
    uVar13 = (undefined2)((ulong)in_stack_fffffffffffffaa0 >> 0x30);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_f4);
    local_50a = 0;
    if (IVar3 != 0) {
      local_50a = QDir::isRelativePath((QString *)in_RDI);
    }
    if ((local_50a & 1) != 0) {
      local_110 = 0xaaaaaaaaaaaaaaaa;
      local_108 = 0xaaaaaaaaaaaaaaaa;
      local_100 = 0xaaaaaaaaaaaaaaaa;
      local_114.super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
           (QFlagsStorage<MakefileGenerator::FileFixifyType>)
           QFlags<MakefileGenerator::FileFixifyType>::operator&
                     ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffa90,
                      (FileFixifyType)((ulong)in_stack_fffffffffffffa88 >> 0x20));
      bVar1 = QFlags<MakefileGenerator::FileFixifyType>::operator!
                        ((QFlags<MakefileGenerator::FileFixifyType> *)&local_114);
      if (bVar1) {
        QMakeProject::projectDir(in_stack_fffffffffffffa88);
      }
      else {
        QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      }
      local_120 = 0xaaaaaaaaaaaaaaaa;
      QString::QString(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      fileInfo((MakefileGenerator *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               (QString *)in_stack_fffffffffffffab8);
      QString::~QString((QString *)0x1764fd);
      uVar4 = QFileInfo::exists();
      if ((uVar4 & 1) != 0) {
        QFileInfo::canonicalFilePath();
        QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
        QString::~QString((QString *)0x176547);
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_120);
      QLatin1Char::QLatin1Char(&local_153,'/');
      QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa9f);
      uVar4 = QString::endsWith((QChar)(char16_t)&local_110,(uint)local_152);
      if ((uVar4 & 1) == 0) {
        QLatin1Char::QLatin1Char(local_157,'/');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa9f);
        c.ucs._1_1_ = in_stack_fffffffffffffa9f.ch;
        c.ucs._0_1_ = in_stack_fffffffffffffa9e;
        QString::operator+=(&in_stack_fffffffffffffa90->a,c);
      }
      QString::prepend(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
      QString::~QString((QString *)0x1765f7);
    }
    Option::fixPathToTargetOS
              ((QString *)in_stack_fffffffffffffaa8,SUB21((ushort)uVar13 >> 8,0),SUB21(uVar13,0));
    QString::operator=(&in_stack_fffffffffffffa90->a,(QString *)in_stack_fffffffffffffa88);
    QString::~QString((QString *)0x17663c);
  }
  bVar1 = QString::isEmpty((QString *)0x177012);
  if (bVar1) {
    QString::operator=((QString *)
                       CONCAT17(in_stack_fffffffffffffa9f.ch,
                                CONCAT16(in_stack_fffffffffffffa9e,
                                         CONCAT24(in_stack_fffffffffffffa9c,
                                                  in_stack_fffffffffffffa98))),
                       (char *)in_stack_fffffffffffffab8);
  }
  if (Option::debug_level != 0) {
    IVar3 = ::QFlags::operator_cast_to_unsigned_int(local_c);
    uVar10 = (ushort)(bVar17 & 1);
    uVar11 = 0;
    uVar12 = 0;
    QString::toLatin1((QString *)in_stack_fffffffffffffa88);
    pcVar6 = QByteArray::constData((QByteArray *)0x17707f);
    QString::toLatin1((QString *)in_stack_fffffffffffffa88);
    pcVar7 = QByteArray::constData((QByteArray *)0x1770a6);
    qmake_getpwd();
    QString::toLatin1((QString *)in_stack_fffffffffffffa88);
    pcVar8 = QByteArray::constData((QByteArray *)0x1770da);
    QString::toLatin1((QString *)in_stack_fffffffffffffa88);
    pcVar9 = QByteArray::constData((QByteArray *)0x177100);
    debug_msg_internal(3,"Fixed[%d,%d] %s :: to :: %s [%s::%s]",(ulong)IVar3,
                       (ulong)CONCAT13(uVar12,CONCAT12(uVar11,uVar10)),pcVar6,pcVar7,pcVar8,pcVar9);
    QByteArray::~QByteArray((QByteArray *)0x177140);
    QByteArray::~QByteArray((QByteArray *)0x17714d);
    QString::~QString((QString *)0x17715a);
    QByteArray::~QByteArray((QByteArray *)0x177167);
    QByteArray::~QByteArray((QByteArray *)0x177174);
  }
  uVar16 = 0x10000;
  QString::~QString((QString *)0x177189);
  if ((uVar16 & 0x10000) == 0) {
    QString::~QString((QString *)0x1771a0);
  }
LAB_001771a2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
LAB_00176f43:
  iVar14 = iVar14 + 1;
  goto LAB_00176d45;
}

Assistant:

QString
MakefileGenerator::fileFixify(const QString &file, FileFixifyTypes fix, bool canon) const
{
    if(file.isEmpty())
        return file;
    QString ret = file;

    //do the fixin'
    QString orig_file = ret;
    if(ret.startsWith(QLatin1Char('~'))) {
        if(ret.startsWith(QLatin1String("~/")))
            ret = QDir::homePath() + ret.mid(1);
        else
            warn_msg(WarnLogic, "Unable to expand ~ in %s", ret.toLatin1().constData());
    }
    if ((fix & FileFixifyAbsolute)
            || (!(fix & FileFixifyRelative) && project->isActiveConfig("no_fixpath"))) {
        if ((fix & FileFixifyAbsolute) && QDir::isRelativePath(ret)) {
            QString pwd = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
            {
                QFileInfo in_fi(fileInfo(pwd));
                if (in_fi.exists())
                    pwd = in_fi.canonicalFilePath();
            }
            if (!pwd.endsWith(QLatin1Char('/')))
                pwd += QLatin1Char('/');
            ret.prepend(pwd);
        }
        ret = Option::fixPathToTargetOS(ret, false, canon);
    } else { //fix it..
        QString out_dir = (fix & FileFixifyToIndir) ? project->projectDir() : Option::output_dir;
        QString in_dir  = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
        {
            QFileInfo in_fi(fileInfo(in_dir));
            if(in_fi.exists())
                in_dir = in_fi.canonicalFilePath();
            QFileInfo out_fi(fileInfo(out_dir));
            if(out_fi.exists())
                out_dir = out_fi.canonicalFilePath();
        }

        QString qfile(Option::normalizePath(ret));
        QFileInfo qfileinfo(fileInfo(qfile));
        if(out_dir != in_dir || !qfileinfo.isRelative()) {
            if(qfileinfo.isRelative()) {
                ret = in_dir + "/" + qfile;
                qfileinfo.setFile(ret);
            }
            ret = Option::fixPathToTargetOS(ret, false, canon);
            QString match_dir = Option::fixPathToTargetOS(out_dir, false, canon);
            if(ret == match_dir) {
                ret = "";
            } else if(ret.startsWith(match_dir + Option::dir_sep)) {
                ret = ret.mid(match_dir.size() + Option::dir_sep.size());
            } else {
                //figure out the depth
                int depth = 4;
                if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                   Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                    if(project && !project->isEmpty("QMAKE_PROJECT_DEPTH"))
                        depth = project->first("QMAKE_PROJECT_DEPTH").toInt();
                    else if(Option::mkfile::cachefile_depth != -1)
                        depth = Option::mkfile::cachefile_depth;
                }
                //calculate how much can be removed
                QString dot_prefix;
                for(int i = 1; i <= depth; i++) {
                    int sl = match_dir.lastIndexOf(Option::dir_sep);
                    if(sl == -1)
                        break;
                    match_dir = match_dir.left(sl);
                    if(match_dir.isEmpty())
                        break;
                    if(ret.startsWith(match_dir + Option::dir_sep)) {
                        //concat
                        int remlen = ret.size() - (match_dir.size() + 1);
                        if(remlen < 0)
                            remlen = 0;
                        ret = ret.right(remlen);
                        //prepend
                        for(int o = 0; o < i; o++)
                            dot_prefix += ".." + Option::dir_sep;
                        break;
                    }
                }
                ret.prepend(dot_prefix);
            }
        } else {
            ret = Option::fixPathToTargetOS(ret, false, canon);
        }
    }
    if(ret.isEmpty())
        ret = ".";
    debug_msg(3, "Fixed[%d,%d] %s :: to :: %s [%s::%s]",
              int(fix), canon, orig_file.toLatin1().constData(), ret.toLatin1().constData(),
              qmake_getpwd().toLatin1().constData(), Option::output_dir.toLatin1().constData());
    return ret;
}